

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  char *p;
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  zip *pzVar5;
  uLong uVar6;
  uint16_t uVar7;
  bool bVar8;
  Bytef *pBVar9;
  z_streamp pzVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  zip_entry *pzVar13;
  void *pvVar14;
  time_t tVar15;
  ulong name_length;
  archive_rb_node *paVar16;
  int64_t iVar17;
  long lVar18;
  int *piVar19;
  Bytef *__src;
  char *__s;
  long request;
  archive_rb_node *paVar20;
  char *pcVar21;
  int iVar22;
  archive_rb_tree *rbt;
  archive_string *as;
  char *unaff_R13;
  archive_rb_tree *paVar23;
  ssize_t bytes_avail;
  archive_rb_node *local_78;
  char *local_70;
  Bytef *local_68;
  z_streamp local_60;
  archive_rb_tree *local_58;
  zip *local_50;
  ulong local_48;
  size_t local_40;
  archive_entry *local_38;
  
  pzVar5 = (zip *)a->format->data;
  if (pzVar5->has_encrypted_entries == -1) {
    pzVar5->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar5->zip_entries == (zip_entry *)0x0) {
    bVar8 = false;
    local_38 = entry;
    iVar17 = __archive_read_seek(a,pzVar5->central_directory_offset,0);
    wVar11 = L'\xffffffe2';
    if (-1 < iVar17) {
      pvVar14 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
      if (pvVar14 != (void *)0x0) {
        do {
          if ((long)local_70 < 5) {
            __archive_read_consume(a,0);
          }
          else {
            iVar17 = 0;
            unaff_R13 = (char *)0x0;
            do {
              cVar1 = *(char *)((long)pvVar14 + iVar17 + 3);
              switch(cVar1) {
              case '\x02':
                if (*(int *)((long)pvVar14 + iVar17) != 0x2014b50) goto switchD_004fb58e_caseD_3;
LAB_004fb5d7:
                pvVar14 = (void *)((long)pvVar14 + iVar17);
                unaff_R13 = (char *)0x1;
                break;
              case '\x03':
              case '\x04':
switchD_004fb58e_caseD_3:
                iVar17 = iVar17 + 4;
                break;
              case '\x06':
                if ((*(int *)((long)pvVar14 + iVar17) == 0x6054b50) ||
                   (*(int *)((long)pvVar14 + iVar17) == 0x6064b50)) goto LAB_004fb5d7;
              case '\x01':
              case '\x05':
                iVar17 = iVar17 + 1;
                break;
              default:
                if (cVar1 == 'P') {
                  iVar17 = iVar17 + 3;
                }
                else {
                  if (cVar1 != 'K') goto switchD_004fb58e_caseD_3;
                  iVar17 = iVar17 + 2;
                }
              }
            } while (((int)unaff_R13 == 0) && (iVar17 < (long)(local_70 + -4)));
            __archive_read_consume(a,iVar17);
            if ((int)unaff_R13 != 0) {
              iVar17 = archive_filter_bytes(&a->archive,0);
              local_68 = (Bytef *)(iVar17 - pzVar5->central_directory_offset);
              paVar23 = &pzVar5->tree;
              __archive_rb_tree_init(paVar23,&rb_ops);
              local_58 = &pzVar5->tree_rsrc;
              __archive_rb_tree_init(local_58,&rb_rsrc_ops);
              pzVar5->central_directory_entries_total = 0;
              goto LAB_004fb66a;
            }
          }
          pvVar14 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
        } while (pvVar14 != (void *)0x0);
      }
      goto LAB_004fb96a;
    }
    goto LAB_004fb96d;
  }
  if (pzVar5->entry != (zip_entry *)0x0) {
    pzVar13 = (zip_entry *)__archive_rb_tree_iterate(&pzVar5->tree,&pzVar5->entry->node,1);
    pzVar5->entry = pzVar13;
  }
  goto LAB_004fb98f;
LAB_004fb66a:
  do {
    piVar19 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
    if (piVar19 == (int *)0x0) goto LAB_004fb6ad;
    iVar22 = 8;
    if ((*piVar19 != 0x6064b50) && (*piVar19 != 0x6054b50)) {
      if (*piVar19 == 0x2014b50) {
        pvVar14 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
        if (pvVar14 != (void *)0x0) {
          pzVar13 = (zip_entry *)calloc(1,0x88);
          pzVar13->next = pzVar5->zip_entries;
          pzVar13->flags = pzVar13->flags | 2;
          pzVar5->zip_entries = pzVar13;
          pzVar5->central_directory_entries_total = pzVar5->central_directory_entries_total + 1;
          pzVar13->system = *(uchar *)((long)pvVar14 + 5);
          bVar2 = *(byte *)((long)pvVar14 + 8);
          pzVar13->zip_flags = *(uint16_t *)((long)pvVar14 + 8);
          if ((bVar2 & 0x41) != 0) {
            pzVar5->has_encrypted_entries = 1;
          }
          pzVar13->compression = *(uchar *)((long)pvVar14 + 10);
          tVar15 = zip_time((char *)((long)pvVar14 + 0xc));
          pzVar13->mtime = tVar15;
          pzVar13->cm_zlib_crc32 = *(uint32_t *)((long)pvVar14 + 0x10);
          pzVar13->compressed_size = (ulong)*(uint *)((long)pvVar14 + 0x14);
          pzVar13->uncompressed_size = (ulong)*(uint *)((long)pvVar14 + 0x18);
          uVar3 = *(ushort *)((long)pvVar14 + 0x1c);
          name_length = (ulong)uVar3;
          uVar4 = *(ushort *)((long)pvVar14 + 0x1e);
          local_48 = (ulong)*(ushort *)((long)pvVar14 + 0x20);
          uVar7 = *(uint16_t *)((long)pvVar14 + 0x28);
          pzVar13->local_header_offset = (ulong)*(uint *)((long)pvVar14 + 0x2a) + (long)local_68;
          pzVar13->mode = 0;
          if (pzVar13->system == '\x03') {
            pzVar13->mode = uVar7;
          }
          __archive_read_consume(a,0x2e);
          local_50 = (zip *)(uVar4 + name_length);
          pcVar21 = (char *)__archive_read_ahead(a,(size_t)local_50,(ssize_t *)0x0);
          if (pcVar21 == (char *)0x0) {
            archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
            iVar22 = 1;
            goto LAB_004fb6b2;
          }
          p = pcVar21 + name_length;
          process_extra(p,(ulong)uVar4,pzVar13);
          rbt = paVar23;
          pzVar10 = (z_streamp)pcVar21;
          if (pzVar5->process_mac_extensions == 0) {
LAB_004fb8ae:
            __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar13);
          }
          else {
            do {
              local_60 = pzVar10;
              __s = pcVar21;
              pvVar14 = memchr(__s,0x2f,(long)p - (long)__s);
              pcVar21 = (char *)((long)pvVar14 + 1);
              pzVar10 = local_60;
            } while (pvVar14 != (void *)0x0);
            if ((uVar3 < 9) ||
               (iVar22 = strncmp("__MACOSX/",(char *)local_60,9), pzVar10 = local_60, iVar22 != 0))
            {
              as = &pzVar13->rsrcname;
              (pzVar13->rsrcname).length = 0;
              archive_strncat(as,"__MACOSX/",9);
              local_40 = (long)__s - (long)local_60;
              archive_strncat(as,local_60,local_40);
              archive_strcat(as,"._");
              archive_strncat(as,__s,name_length - local_40);
              goto LAB_004fb8ae;
            }
            if ((p[-1] == '/') ||
               (((2 < (long)__s - (long)local_60 && (*__s == '.')) && (__s[1] == '_')))) {
              (pzVar13->rsrcname).length = 0;
              archive_strncat(&pzVar13->rsrcname,local_60,name_length);
              rbt = local_58;
              goto LAB_004fb8ae;
            }
            __archive_rb_tree_insert_node(paVar23,(archive_rb_node *)pzVar13);
            expose_parent_dirs(pzVar5,(char *)pzVar10,name_length);
          }
          __archive_read_consume(a,local_48 + (long)local_50);
          iVar22 = 0;
          goto LAB_004fb6b2;
        }
      }
      else {
        archive_set_error(&a->archive,-1,"Invalid central directory signature");
      }
LAB_004fb6ad:
      iVar22 = 1;
    }
LAB_004fb6b2:
    unaff_R13 = "Invalid central directory signature";
  } while (iVar22 == 0);
  if (iVar22 == 8) {
    wVar11 = L'\0';
    bVar8 = true;
  }
  else {
LAB_004fb96a:
    bVar8 = false;
  }
LAB_004fb96d:
  if (!bVar8) {
    return wVar11;
  }
  pzVar13 = (zip_entry *)__archive_rb_tree_iterate(&pzVar5->tree,(archive_rb_node *)0x0,0);
  pzVar5->entry = pzVar13;
  entry = local_38;
LAB_004fb98f:
  if (pzVar5->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar21 = (pzVar5->entry->rsrcname).s;
  if (pcVar21 == (char *)0x0) {
    paVar16 = (archive_rb_node *)0x0;
  }
  else {
    paVar16 = __archive_rb_tree_find_node(&pzVar5->tree_rsrc,pcVar21);
  }
  iVar17 = archive_filter_bytes(&a->archive,0);
  lVar18 = pzVar5->entry->local_header_offset;
  request = lVar18 - iVar17;
  if (request == 0 || lVar18 < iVar17) {
    if (request != 0) {
      __archive_read_seek(a,lVar18,0);
    }
  }
  else {
    __archive_read_consume(a,request);
  }
  pzVar5->unconsumed = 0;
  local_38 = entry;
  wVar11 = zip_read_local_file_header(a,entry,pzVar5);
  if (wVar11 != L'\0') {
    return wVar11;
  }
  if (paVar16 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar5 = (zip *)a->format->data;
  iVar17 = archive_filter_bytes(&a->archive,0);
  if ((*(byte *)(paVar16[5].rb_nodes + 1) & 0xf7) == 0) {
    paVar20 = paVar16[2].rb_nodes[0];
    if ((long)paVar20 < 0x400001) {
      local_58 = (archive_rb_tree *)malloc((size_t)paVar20);
      if (local_58 == (archive_rb_tree *)0x0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Mac metadata");
        wVar11 = L'\xffffffe2';
        goto LAB_004fbad4;
      }
      paVar20 = paVar16[1].rb_nodes[1];
      lVar18 = (long)paVar20 - iVar17;
      if (lVar18 == 0 || (long)paVar20 < iVar17) {
        if (lVar18 != 0) {
          __archive_read_seek(a,(int64_t)paVar20,0);
        }
      }
      else {
        __archive_read_consume(a,lVar18);
      }
      piVar19 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
      local_40 = iVar17;
      if (piVar19 == (int *)0x0) {
        pcVar21 = "Truncated ZIP file header";
        iVar22 = 0x54;
LAB_004fbb56:
        archive_set_error(&a->archive,iVar22,pcVar21);
        iVar17 = -0x14;
      }
      else {
        if (*piVar19 != 0x4034b50) {
          pcVar21 = "Damaged Zip archive";
          iVar22 = -1;
          goto LAB_004fbb56;
        }
        iVar17 = (ulong)*(ushort *)((long)piVar19 + 0x1a) + (ulong)*(ushort *)(piVar19 + 7) + 0x1e;
      }
      __archive_read_consume(a,iVar17);
      pcVar21 = (char *)paVar16[1].rb_info;
      local_78 = paVar16[2].rb_nodes[0];
      local_60 = &pzVar5->stream;
      wVar12 = L'\0';
      iVar22 = 0;
      local_68 = (Bytef *)local_58;
      local_50 = pzVar5;
      do {
        paVar23 = local_58;
        if ((iVar22 != 0) || (pcVar21 == (char *)0x0)) {
          archive_entry_copy_mac_metadata
                    (local_38,local_58,(long)paVar16[2].rb_nodes[0] - (long)local_78);
          goto LAB_004fbda6;
        }
        __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
        pzVar5 = local_50;
        pBVar9 = local_68;
        if (__src == (Bytef *)0x0) {
          archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
          wVar11 = L'\x05';
          wVar12 = L'\xffffffec';
        }
        else {
          if (pcVar21 < local_70) {
            local_70 = pcVar21;
          }
          if (*(char *)(paVar16[5].rb_nodes + 1) == '\b') {
            local_48 = local_48 & 0xffffffff00000000;
            wVar12 = zip_deflate_init(a,local_50);
            pBVar9 = local_68;
            if (wVar12 == L'\0') {
              (pzVar5->stream).next_in = __src;
              (pzVar5->stream).avail_in = (uInt)local_70;
              (pzVar5->stream).total_in = 0;
              (pzVar5->stream).next_out = local_68;
              (pzVar5->stream).avail_out = (uInt)local_78;
              (pzVar5->stream).total_out = 0;
              iVar22 = cm_zlib_inflate(local_60,0);
              if (iVar22 == -4) {
                archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
LAB_004fbd50:
                bVar8 = false;
                wVar12 = L'\xffffffe2';
              }
              else {
                if (iVar22 != 0) {
                  if (iVar22 != 1) {
                    archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)");
                    goto LAB_004fbd50;
                  }
                  local_48 = CONCAT44(local_48._4_4_,1);
                }
                unaff_R13 = (char *)(pzVar5->stream).total_in;
                uVar6 = (pzVar5->stream).total_out;
                local_78 = (archive_rb_node *)((long)local_78 - uVar6);
                local_68 = pBVar9 + uVar6;
                bVar8 = true;
                wVar12 = L'\0';
              }
            }
            else {
              bVar8 = false;
            }
            wVar11 = L'\x05';
            iVar22 = (int)local_48;
            if (!bVar8) goto LAB_004fbd76;
          }
          else if (*(char *)(paVar16[5].rb_nodes + 1) == '\0') {
            memcpy(local_68,__src,(size_t)local_70);
            local_68 = pBVar9 + (long)local_70;
            local_78 = (archive_rb_node *)((long)local_78 - (long)local_70);
            unaff_R13 = local_70;
            if (local_78 == (archive_rb_node *)0x0) {
              iVar22 = 1;
            }
          }
          else {
            unaff_R13 = (char *)0x0;
          }
          __archive_read_consume(a,(int64_t)unaff_R13);
          pcVar21 = pcVar21 + -(long)unaff_R13;
          wVar11 = L'\0';
        }
LAB_004fbd76:
      } while (wVar11 == L'\0');
      paVar23 = local_58;
      if (wVar11 == L'\x05') {
LAB_004fbda6:
        wVar11 = wVar12;
        __archive_read_seek(a,local_40,0);
        local_50->decompress_init = '\0';
        free(paVar23);
      }
      goto LAB_004fbad4;
    }
    pcVar21 = "Mac metadata is too large: %jd > 4M bytes";
  }
  else {
    lVar18 = 8;
    paVar20 = (archive_rb_node *)0x5b0968;
    do {
      if (*(uint *)((long)&PTR_bid_keyword_keys_u_006c6a38 + lVar18) ==
          (uint)*(byte *)(paVar16[5].rb_nodes + 1)) {
        paVar20 = *(archive_rb_node **)((long)&compression_methods[0].id + lVar18);
        break;
      }
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x168);
    pcVar21 = "Unsupported ZIP compression method (%s)";
  }
  archive_set_error(&a->archive,0x54,pcVar21,paVar20);
  wVar11 = L'\xffffffec';
LAB_004fbad4:
  return wVar11 >> 0x1f & wVar11;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid redundant
	 * data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset, SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}